

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O3

TestStatus *
vkt::tessellation::anon_unknown_1::Barrier::test
          (TestStatus *__return_storage_ptr__,Context *context)

{
  undefined1 auVar1 [16];
  undefined8 *vertexData;
  long lVar2;
  value_type_conflict3 *__val;
  DrawFunction DVar3;
  DrawFunction DVar4;
  DrawFunction DVar5;
  DrawFunction DVar6;
  undefined1 auVar7 [16];
  TextureLevel referenceImage;
  ConstPixelBufferAccess local_48;
  
  vertexData = (undefined8 *)operator_new(0x80);
  *vertexData = 0;
  vertexData[1] = 0;
  vertexData[2] = 0;
  vertexData[3] = 0;
  vertexData[4] = 0;
  vertexData[5] = 0;
  vertexData[6] = 0;
  vertexData[7] = 0;
  vertexData[8] = 0;
  vertexData[9] = 0;
  vertexData[10] = 0;
  vertexData[0xb] = 0;
  vertexData[0xc] = 0;
  vertexData[0xd] = 0;
  vertexData[0xe] = 0;
  vertexData[0xf] = 0;
  auVar1 = _DAT_00b45cb0;
  DVar3 = FUNCTION_DRAW;
  DVar4 = FUNCTION_DRAW_INDEXED;
  DVar5 = FUNCTION_DRAW_INDIRECT;
  DVar6 = FUNCTION_DRAW_INDEXED_INDIRECT;
  lVar2 = 0;
  do {
    auVar7._0_4_ = ((float)(DVar3 >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(DVar3 & 0xffff | 0x4b000000);
    auVar7._4_4_ = ((float)(DVar4 >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(DVar4 & 0xffff | 0x4b000000);
    auVar7._8_4_ = ((float)(DVar5 >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(DVar5 & 0xffff | 0x4b000000);
    auVar7._12_4_ =
         ((float)(DVar6 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(DVar6 & 0xffff | 0x4b000000)
    ;
    auVar7 = divps(auVar7,auVar1);
    *(undefined1 (*) [16])((long)vertexData + lVar2 * 4) = auVar7;
    lVar2 = lVar2 + 4;
    DVar3 = DVar3 + FUNTION_LAST;
    DVar4 = DVar4 + FUNTION_LAST;
    DVar5 = DVar5 + FUNTION_LAST;
    DVar6 = DVar6 + FUNTION_LAST;
  } while (lVar2 != 0x20);
  tcu::TextureLevel::TextureLevel(&referenceImage);
  tcu::ImageIO::loadPNG
            (&referenceImage,context->m_testCtx->m_curArchive,
             "vulkan/data/tessellation/barrier_ref.png");
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_48,&referenceImage);
  runTest(__return_storage_ptr__,context,1,0x20,0x20,VK_FORMAT_R32_SFLOAT,vertexData,0x80,&local_48)
  ;
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  operator_delete(vertexData,0x80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context)
{
	// Input vertex attribute data
	std::vector<float> vertexData		(NUM_VERTICES);
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	for (int i = 0; i < NUM_VERTICES; ++i)
		vertexData[i] = static_cast<float>(i) / (NUM_VERTICES - 1);

	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), "vulkan/data/tessellation/barrier_ref.png");

	const int numPrimitives = 1;
	const int inPatchSize   = NUM_VERTICES;
	const int outPatchSize  = NUM_VERTICES;

	return runTest(context, numPrimitives, inPatchSize, outPatchSize,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}